

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar7 [56];
  SampledSpectrum SVar8;
  float local_48 [2];
  Float local_40;
  RGB local_38;
  RGBReflectanceSpectrum local_2c;
  undefined1 auVar5 [56];
  undefined1 auVar6 [64];
  
  iVar2 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,local_48);
  if (iVar2 == 1) {
    auVar3._4_4_ = local_48[0];
    auVar3._0_4_ = local_48[0];
    auVar3._8_4_ = local_48[0];
    auVar3._12_4_ = local_48[0];
  }
  else {
    auVar5 = (undefined1  [56])0x0;
    auVar7 = ZEXT856(0);
    local_38.b = local_40;
    RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_2c,RGBColorSpace::sRGB,&local_38);
    SVar8 = RGBReflectanceSpectrum::Sample(&local_2c,&lambda);
    auVar6._0_8_ = SVar8.values.values._8_8_;
    auVar6._8_56_ = auVar7;
    auVar4._0_8_ = SVar8.values.values._0_8_;
    auVar4._8_56_ = auVar5;
    auVar3 = vunpcklpd_avx(auVar4._0_16_,auVar6._0_16_);
  }
  auVar1 = vshufpd_avx(auVar3,auVar3,1);
  SVar8.values.values._0_8_ = auVar3._0_8_;
  SVar8.values.values._8_8_ = auVar1._0_8_;
  return (SampledSpectrum)SVar8.values.values;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB,
                                  RGB(result[0], result[1], result[2]))
        .Sample(lambda);
#endif
}